

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestTestCommand.cxx
# Opt level: O3

void __thiscall cmCTestTestCommand::cmCTestTestCommand(cmCTestTestCommand *this)

{
  cmCTestHandlerCommand::cmCTestHandlerCommand(&this->super_cmCTestHandlerCommand);
  (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand._vptr_cmCommand =
       (_func_int **)&PTR__cmCTestHandlerCommand_0070d3c0;
  (this->super_cmCTestHandlerCommand).Arguments.
  super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.super__Vector_impl_data.
  _M_start[8] = "START";
  (this->super_cmCTestHandlerCommand).Arguments.
  super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.super__Vector_impl_data.
  _M_start[9] = "END";
  (this->super_cmCTestHandlerCommand).Arguments.
  super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.super__Vector_impl_data.
  _M_start[10] = "STRIDE";
  (this->super_cmCTestHandlerCommand).Arguments.
  super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.super__Vector_impl_data.
  _M_start[0xb] = "EXCLUDE";
  (this->super_cmCTestHandlerCommand).Arguments.
  super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.super__Vector_impl_data.
  _M_start[0xc] = "INCLUDE";
  (this->super_cmCTestHandlerCommand).Arguments.
  super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.super__Vector_impl_data.
  _M_start[0xd] = "EXCLUDE_LABEL";
  (this->super_cmCTestHandlerCommand).Arguments.
  super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.super__Vector_impl_data.
  _M_start[0xe] = "INCLUDE_LABEL";
  (this->super_cmCTestHandlerCommand).Arguments.
  super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.super__Vector_impl_data.
  _M_start[0xf] = "EXCLUDE_FIXTURE";
  (this->super_cmCTestHandlerCommand).Arguments.
  super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.super__Vector_impl_data.
  _M_start[0x10] = "EXCLUDE_FIXTURE_SETUP";
  (this->super_cmCTestHandlerCommand).Arguments.
  super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.super__Vector_impl_data.
  _M_start[0x11] = "EXCLUDE_FIXTURE_CLEANUP";
  (this->super_cmCTestHandlerCommand).Arguments.
  super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.super__Vector_impl_data.
  _M_start[0x12] = "PARALLEL_LEVEL";
  (this->super_cmCTestHandlerCommand).Arguments.
  super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.super__Vector_impl_data.
  _M_start[0x13] = "SCHEDULE_RANDOM";
  (this->super_cmCTestHandlerCommand).Arguments.
  super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.super__Vector_impl_data.
  _M_start[0x14] = "STOP_TIME";
  (this->super_cmCTestHandlerCommand).Arguments.
  super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.super__Vector_impl_data.
  _M_start[0x15] = "TEST_LOAD";
  (this->super_cmCTestHandlerCommand).Arguments.
  super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.super__Vector_impl_data.
  _M_start[0x16] = (char *)0x0;
  (this->super_cmCTestHandlerCommand).Last = 0x16;
  return;
}

Assistant:

cmCTestTestCommand::cmCTestTestCommand()
{
  this->Arguments[ctt_START] = "START";
  this->Arguments[ctt_END] = "END";
  this->Arguments[ctt_STRIDE] = "STRIDE";
  this->Arguments[ctt_EXCLUDE] = "EXCLUDE";
  this->Arguments[ctt_INCLUDE] = "INCLUDE";
  this->Arguments[ctt_EXCLUDE_LABEL] = "EXCLUDE_LABEL";
  this->Arguments[ctt_INCLUDE_LABEL] = "INCLUDE_LABEL";
  this->Arguments[ctt_EXCLUDE_FIXTURE] = "EXCLUDE_FIXTURE";
  this->Arguments[ctt_EXCLUDE_FIXTURE_SETUP] = "EXCLUDE_FIXTURE_SETUP";
  this->Arguments[ctt_EXCLUDE_FIXTURE_CLEANUP] = "EXCLUDE_FIXTURE_CLEANUP";
  this->Arguments[ctt_PARALLEL_LEVEL] = "PARALLEL_LEVEL";
  this->Arguments[ctt_SCHEDULE_RANDOM] = "SCHEDULE_RANDOM";
  this->Arguments[ctt_STOP_TIME] = "STOP_TIME";
  this->Arguments[ctt_TEST_LOAD] = "TEST_LOAD";
  this->Arguments[ctt_LAST] = nullptr;
  this->Last = ctt_LAST;
}